

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool PairSearchOverlapHelper(ON_RTreeBBox *a_rectA,ON_RTreeBBox *a_rectB,double tolerance)

{
  double dVar1;
  double local_70;
  double local_68;
  double local_60;
  double *mx;
  double *mn;
  double d;
  double dz;
  double dy;
  double dx;
  double tolerance_local;
  ON_RTreeBBox *a_rectB_local;
  ON_RTreeBBox *a_rectA_local;
  
  dy = a_rectB->m_min[0] - a_rectA->m_max[0];
  if (dy <= tolerance) {
    dz = a_rectB->m_min[1] - a_rectA->m_max[1];
    if (dz <= tolerance) {
      d = a_rectB->m_min[2] - a_rectA->m_max[2];
      if (d <= tolerance) {
        dVar1 = a_rectA->m_min[0] - a_rectB->m_max[0];
        if (dVar1 <= tolerance) {
          if (dy < dVar1) {
            dy = dVar1;
          }
          dVar1 = a_rectA->m_min[1] - a_rectB->m_max[1];
          if (dVar1 <= tolerance) {
            if (dz < dVar1) {
              dz = dVar1;
            }
            dVar1 = a_rectA->m_min[2] - a_rectB->m_max[2];
            if (dVar1 <= tolerance) {
              if (d < dVar1) {
                d = dVar1;
              }
              if (dy <= 0.0) {
                local_60 = 0.0;
              }
              else {
                local_60 = dy * dy;
              }
              if (dz <= 0.0) {
                local_68 = 0.0;
              }
              else {
                local_68 = dz * dz;
              }
              if (d <= 0.0) {
                local_70 = 0.0;
              }
              else {
                local_70 = d * d;
              }
              a_rectA_local._7_1_ = local_70 + local_68 + local_60 <= tolerance * tolerance;
            }
            else {
              a_rectA_local._7_1_ = false;
            }
          }
          else {
            a_rectA_local._7_1_ = false;
          }
        }
        else {
          a_rectA_local._7_1_ = false;
        }
      }
      else {
        a_rectA_local._7_1_ = false;
      }
    }
    else {
      a_rectA_local._7_1_ = false;
    }
  }
  else {
    a_rectA_local._7_1_ = false;
  }
  return a_rectA_local._7_1_;
}

Assistant:

static bool PairSearchOverlapHelper( const ON_RTreeBBox* a_rectA, const ON_RTreeBBox* a_rectB, double tolerance )
{
  double dx,dy,dz,d;
  const double* mn;
  const double* mx;


  mx = a_rectA->m_max;
  mn = a_rectB->m_min;
  dx = *mn++ - *mx++;
  if ( dx > tolerance ) return false;
  dy = *mn++ - *mx++;
  if ( dy > tolerance ) return false;
  dz = *mn - *mx;
  if ( dz > tolerance ) return false;

  mx = a_rectB->m_max;
  mn = a_rectA->m_min;
  d = *mn++ - *mx++;
  if ( d > tolerance ) return false;
  if ( d > dx ) dx = d;
  d = *mn++ - *mx++;
  if ( d > tolerance ) return false;
  if ( d > dy ) dy = d;
  d = *mn++ - *mx++;
  if ( d > tolerance ) return false;
  if ( d > dz ) dz = d;

  d  = (dx > 0.0) ? dx*dx : 0.0;
  d += (dy > 0.0) ? dy*dy : 0.0;
  d += (dz > 0.0) ? dz*dz : 0.0;

  return (d <= tolerance*tolerance);
}